

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_rangeproof_info
              (secp256k1_context *ctx,int *exp,int *mantissa,uint64_t *min_value,uint64_t *max_value
              ,uchar *proof,size_t plen)

{
  uint64_t local_50;
  uint64_t scale;
  size_t offset;
  uchar *proof_local;
  uint64_t *max_value_local;
  uint64_t *min_value_local;
  int *mantissa_local;
  int *exp_local;
  secp256k1_context *ctx_local;
  
  offset = (size_t)proof;
  proof_local = (uchar *)max_value;
  max_value_local = min_value;
  min_value_local = (uint64_t *)mantissa;
  mantissa_local = exp;
  exp_local = (int *)ctx;
  if (exp == (int *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"exp != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (mantissa == (int *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"mantissa != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (min_value == (uint64_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"min_value != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (max_value == (uint64_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"max_value != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (proof == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    scale = 0;
    local_50 = 1;
    ctx_local._4_4_ =
         secp256k1_rangeproof_getheader_impl
                   (&scale,exp,mantissa,&local_50,min_value,max_value,proof,plen);
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_rangeproof_info(const secp256k1_context* ctx, int *exp, int *mantissa,
 uint64_t *min_value, uint64_t *max_value, const unsigned char *proof, size_t plen) {
    size_t offset;
    uint64_t scale;
    ARG_CHECK(exp != NULL);
    ARG_CHECK(mantissa != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(proof != NULL);
    offset = 0;
    scale = 1;
    (void)ctx;
    return secp256k1_rangeproof_getheader_impl(&offset, exp, mantissa, &scale, min_value, max_value, proof, plen);
}